

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

void res_init(ResourceData *pResData,uint8_t *formatVersion,void *inBytes,int32_t length,
             UErrorCode *errorCode)

{
  uint uVar1;
  int32_t *piVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  int32_t att;
  int32_t indexLength;
  int32_t *indexes;
  UResType rootType;
  UErrorCode *errorCode_local;
  int32_t length_local;
  void *inBytes_local;
  uint8_t *formatVersion_local;
  ResourceData *pResData_local;
  
  pResData->pRoot = (int32_t *)inBytes;
  pResData->rootRes = *pResData->pRoot;
  pResData->p16BitUnits = &gEmpty16;
  if (-1 < length) {
    bVar5 = false;
    if (*formatVersion == '\x01') {
      bVar5 = formatVersion[1] == '\0';
    }
    iVar4 = 6;
    if (bVar5) {
      iVar4 = 1;
    }
    if (length / 4 < iVar4) {
      *errorCode = U_INVALID_FORMAT_ERROR;
      res_unload_63(pResData);
      return;
    }
  }
  uVar3 = pResData->rootRes >> 0x1c;
  if (((uVar3 != 2) && (uVar3 != 5)) && (uVar3 != 4)) {
    *errorCode = U_INVALID_FORMAT_ERROR;
    res_unload_63(pResData);
    return;
  }
  if ((*formatVersion == '\x01') && (formatVersion[1] == '\0')) {
    pResData->localKeyLimit = 0x10000;
  }
  else {
    piVar2 = pResData->pRoot;
    uVar3 = piVar2[1] & 0xff;
    if (uVar3 < 5) {
      *errorCode = U_INVALID_FORMAT_ERROR;
      res_unload_63(pResData);
      return;
    }
    if ((-1 < length) && ((length < (int)((uVar3 + 1) * 4) || (length < piVar2[4] * 4)))) {
      *errorCode = U_INVALID_FORMAT_ERROR;
      res_unload_63(pResData);
      return;
    }
    if ((int)(uVar3 + 1) < piVar2[2]) {
      pResData->localKeyLimit = piVar2[2] << 2;
    }
    if (2 < *formatVersion) {
      pResData->poolStringIndexLimit = (uint)piVar2[1] >> 8;
    }
    if (5 < uVar3) {
      uVar1 = piVar2[6];
      pResData->noFallback = (byte)uVar1 & 1;
      pResData->isPoolBundle = (uVar1 & 2) != 0;
      pResData->usesPoolBundle = (uVar1 & 4) != 0;
      pResData->poolStringIndexLimit = (uVar1 & 0xf000) << 0xc | pResData->poolStringIndexLimit;
      pResData->poolStringIndex16Limit = uVar1 >> 0x10;
    }
    if (((pResData->isPoolBundle != '\0') || (pResData->usesPoolBundle != '\0')) && (uVar3 < 8)) {
      *errorCode = U_INVALID_FORMAT_ERROR;
      res_unload_63(pResData);
      return;
    }
    if ((6 < uVar3) && (piVar2[2] < piVar2[7])) {
      pResData->p16BitUnits = (uint16_t *)(pResData->pRoot + piVar2[2]);
    }
  }
  pResData->useNativeStrcmp = '\x01';
  return;
}

Assistant:

static void
res_init(ResourceData *pResData,
         UVersionInfo formatVersion, const void *inBytes, int32_t length,
         UErrorCode *errorCode) {
    UResType rootType;

    /* get the root resource */
    pResData->pRoot=(const int32_t *)inBytes;
    pResData->rootRes=(Resource)*pResData->pRoot;
    pResData->p16BitUnits=&gEmpty16;

    /* formatVersion 1.1 must have a root item and at least 5 indexes */
    if(length>=0 && (length/4)<((formatVersion[0]==1 && formatVersion[1]==0) ? 1 : 1+5)) {
        *errorCode=U_INVALID_FORMAT_ERROR;
        res_unload(pResData);
        return;
    }

    /* currently, we accept only resources that have a Table as their roots */
    rootType=(UResType)RES_GET_TYPE(pResData->rootRes);
    if(!URES_IS_TABLE(rootType)) {
        *errorCode=U_INVALID_FORMAT_ERROR;
        res_unload(pResData);
        return;
    }

    if(formatVersion[0]==1 && formatVersion[1]==0) {
        pResData->localKeyLimit=0x10000;  /* greater than any 16-bit key string offset */
    } else {
        /* bundles with formatVersion 1.1 and later contain an indexes[] array */
        const int32_t *indexes=pResData->pRoot+1;
        int32_t indexLength=indexes[URES_INDEX_LENGTH]&0xff;
        if(indexLength<=URES_INDEX_MAX_TABLE_LENGTH) {
            *errorCode=U_INVALID_FORMAT_ERROR;
            res_unload(pResData);
            return;
        }
        if( length>=0 &&
            (length<((1+indexLength)<<2) ||
             length<(indexes[URES_INDEX_BUNDLE_TOP]<<2))
        ) {
            *errorCode=U_INVALID_FORMAT_ERROR;
            res_unload(pResData);
            return;
        }
        if(indexes[URES_INDEX_KEYS_TOP]>(1+indexLength)) {
            pResData->localKeyLimit=indexes[URES_INDEX_KEYS_TOP]<<2;
        }
        if(formatVersion[0]>=3) {
            // In formatVersion 1, the indexLength took up this whole int.
            // In version 2, bits 31..8 were reserved and always 0.
            // In version 3, they contain bits 23..0 of the poolStringIndexLimit.
            // Bits 27..24 are in indexes[URES_INDEX_ATTRIBUTES] bits 15..12.
            pResData->poolStringIndexLimit=(int32_t)((uint32_t)indexes[URES_INDEX_LENGTH]>>8);
        }
        if(indexLength>URES_INDEX_ATTRIBUTES) {
            int32_t att=indexes[URES_INDEX_ATTRIBUTES];
            pResData->noFallback=(UBool)(att&URES_ATT_NO_FALLBACK);
            pResData->isPoolBundle=(UBool)((att&URES_ATT_IS_POOL_BUNDLE)!=0);
            pResData->usesPoolBundle=(UBool)((att&URES_ATT_USES_POOL_BUNDLE)!=0);
            pResData->poolStringIndexLimit|=(att&0xf000)<<12;  // bits 15..12 -> 27..24
            pResData->poolStringIndex16Limit=(int32_t)((uint32_t)att>>16);
        }
        if((pResData->isPoolBundle || pResData->usesPoolBundle) && indexLength<=URES_INDEX_POOL_CHECKSUM) {
            *errorCode=U_INVALID_FORMAT_ERROR;
            res_unload(pResData);
            return;
        }
        if( indexLength>URES_INDEX_16BIT_TOP &&
            indexes[URES_INDEX_16BIT_TOP]>indexes[URES_INDEX_KEYS_TOP]
        ) {
            pResData->p16BitUnits=(const uint16_t *)(pResData->pRoot+indexes[URES_INDEX_KEYS_TOP]);
        }
    }

    if(formatVersion[0]==1 || U_CHARSET_FAMILY==U_ASCII_FAMILY) {
        /*
         * formatVersion 1: compare key strings in native-charset order
         * formatVersion 2 and up: compare key strings in ASCII order
         */
        pResData->useNativeStrcmp=TRUE;
    }
}